

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pizza_cutter.cpp
# Opt level: O2

optional<pizza_slice> * __thiscall
pizza_cutter::extend_slice
          (optional<pizza_slice> *__return_storage_ptr__,pizza_cutter *this,pizza_slice ps,
          direction dir)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  pizza_slice new_part;
  pizza_slice new_part_00;
  pizza_slice new_part_01;
  
  uVar6 = ps._8_8_;
  uVar7 = ps._0_8_;
  uVar4 = ps.col1;
  uVar5 = ps.col2;
  switch(dir) {
  case right:
    uVar5 = uVar5 + 1;
    uVar3 = uVar5;
    goto LAB_001031df;
  case down:
    uVar3 = ps.row2 + 1;
    uVar2 = uVar7 & 0xffffffff00000000 | (ulong)uVar3;
    uVar6 = uVar6 & 0xffffffff00000000 | (ulong)uVar3;
    new_part_01.row2 = (int)uVar6;
    new_part_01.col2 = (int)(uVar6 >> 0x20);
    new_part_01.row1 = (int)uVar2;
    new_part_01.col1 = (int)(uVar2 >> 0x20);
    bVar1 = is_new_part_valid(this,new_part_01);
    uVar6 = (ulong)uVar3;
    break;
  case left:
    uVar4 = uVar4 - 1;
    uVar3 = uVar4;
LAB_001031df:
    uVar2 = uVar7 & 0xffffffff | (ulong)uVar3 << 0x20;
    new_part._8_8_ = uVar6 & 0xffffffff | (ulong)uVar3 << 0x20;
    new_part.row1 = (int)uVar2;
    new_part.col1 = (int)(uVar2 >> 0x20);
    bVar1 = is_new_part_valid(this,new_part);
    break;
  case up:
    uVar3 = ps.row1 - 1;
    uVar7 = uVar7 & 0xffffffff00000000 | (ulong)uVar3;
    new_part_00._8_8_ = uVar6 & 0xffffffff00000000 | (ulong)uVar3;
    new_part_00.row1 = (int)uVar7;
    new_part_00.col1 = (int)(uVar7 >> 0x20);
    bVar1 = is_new_part_valid(this,new_part_00);
    uVar7 = (ulong)uVar3;
    break;
  default:
    goto switchD_001031cf_default;
  }
  if (bVar1 == false) {
switchD_001031cf_default:
    bVar1 = false;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
    super__Optional_payload_base<pizza_slice>._M_payload._M_value.row1 = (int)uVar7;
    (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
    super__Optional_payload_base<pizza_slice>._M_payload._M_value.col1 = uVar4;
    (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
    super__Optional_payload_base<pizza_slice>._M_payload._M_value.row2 = (int)uVar6;
    (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
    super__Optional_payload_base<pizza_slice>._M_payload._M_value.col2 = uVar5;
    bVar1 = true;
  }
  (__return_storage_ptr__->super__Optional_base<pizza_slice,_true,_true>)._M_payload.
  super__Optional_payload_base<pizza_slice>._M_engaged = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::optional<pizza_slice> pizza_cutter::extend_slice(pizza_slice ps, direction dir) const noexcept
{
    switch(dir) {
        case direction::right:
            if (is_new_part_valid(pizza_slice{ps.row1, ps.col2 + 1, ps.row2, ps.col2 + 1}))
                return pizza_slice{ps.row1, ps.col1, ps.row2, ps.col2 + 1};
            break;
        case direction::down:
            if (is_new_part_valid(pizza_slice{ps.row2 + 1, ps.col1, ps.row2 + 1, ps.col2}))
                return pizza_slice{ps.row1, ps.col1, ps.row2 + 1, ps.col2};
            break;
        case direction::left:
            if (is_new_part_valid(pizza_slice{ps.row1, ps.col1 - 1, ps.row2, ps.col1 - 1}))
                return pizza_slice{ps.row1, ps.col1 - 1, ps.row2, ps.col2};
            break;
        case direction::up:
            if (is_new_part_valid(pizza_slice{ps.row1 - 1, ps.col1, ps.row1 - 1, ps.col2}))
                return pizza_slice{ps.row1 - 1, ps.col1, ps.row2, ps.col2};
            break;
    }
    return std::nullopt;
}